

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

string * cmExtraEclipseCDT4Generator::GenerateProjectName
                   (string *__return_storage_ptr__,string *name,string *type,string *path)

{
  char cVar1;
  char *__rhs;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *path_local;
  string *type_local;
  string *name_local;
  
  local_28 = path;
  path_local = type;
  type_local = name;
  name_local = __return_storage_ptr__;
  EscapeForXML(&local_a8,name);
  cVar1 = std::__cxx11::string::empty();
  __rhs = "-";
  if (cVar1 != '\0') {
    __rhs = "";
  }
  std::operator+(&local_88,&local_a8,__rhs);
  std::operator+(&local_68,&local_88,path_local);
  std::operator+(&local_48,&local_68,"@");
  std::operator+(__return_storage_ptr__,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraEclipseCDT4Generator::GenerateProjectName(const std::string& name,
                                                 const std::string& type,
                                                 const std::string& path)
{
  return cmExtraEclipseCDT4Generator::EscapeForXML(name)
                                +(type.empty() ? "" : "-") + type + "@" + path;
}